

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O0

bc_slist_t * blogc_template_parse_from_file(char *f,bc_error_t **err)

{
  char *src;
  bc_slist_t *pbVar1;
  bc_slist_t *rv;
  char *s;
  size_t len;
  bc_error_t **err_local;
  char *f_local;
  
  if ((err == (bc_error_t **)0x0) || (*err != (bc_error_t *)0x0)) {
    f_local = (char *)0x0;
  }
  else {
    len = (size_t)err;
    err_local = (bc_error_t **)f;
    src = bc_file_get_contents(f,true,(size_t *)&s,err);
    if (src == (char *)0x0) {
      f_local = (char *)0x0;
    }
    else {
      pbVar1 = blogc_template_parse(src,(size_t)s,(bc_error_t **)len);
      free(src);
      f_local = (char *)pbVar1;
    }
  }
  return (bc_slist_t *)f_local;
}

Assistant:

bc_slist_t*
blogc_template_parse_from_file(const char *f, bc_error_t **err)
{
    if (err == NULL || *err != NULL)
        return NULL;

    size_t len;
    char *s = bc_file_get_contents(f, true, &len, err);
    if (s == NULL)
        return NULL;
    bc_slist_t *rv = blogc_template_parse(s, len, err);
    free(s);
    return rv;
}